

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void highbd_dr_prediction_z1_32xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx,
               int bd)

{
  uint16_t uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ushort uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint16_t *puVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [32];
  ushort uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  int max_base_x;
  __m256i dstvec [128];
  undefined8 auStack_1060 [518];
  undefined1 auVar22 [32];
  
  uVar1 = above[(long)N + 0x1f];
  auVar21._2_2_ = uVar1;
  auVar21._0_2_ = uVar1;
  auVar21._4_2_ = uVar1;
  auVar21._6_2_ = uVar1;
  auVar21._8_2_ = uVar1;
  auVar21._10_2_ = uVar1;
  auVar21._12_2_ = uVar1;
  auVar21._14_2_ = uVar1;
  auVar22._16_2_ = uVar1;
  auVar22._0_16_ = auVar21;
  auVar22._18_2_ = uVar1;
  auVar22._20_2_ = uVar1;
  auVar22._22_2_ = uVar1;
  auVar22._24_2_ = uVar1;
  auVar22._26_2_ = uVar1;
  auVar22._28_2_ = uVar1;
  auVar22._30_2_ = uVar1;
  uVar12 = N + 0x1f;
  auVar29._0_2_ = (undefined2)uVar12;
  if (dx < 0xc) {
    if (0 < N) {
      auVar29._2_2_ = auVar29._0_2_;
      auVar29._4_2_ = auVar29._0_2_;
      auVar29._6_2_ = auVar29._0_2_;
      auVar29._8_2_ = auVar29._0_2_;
      auVar29._10_2_ = auVar29._0_2_;
      auVar29._12_2_ = auVar29._0_2_;
      auVar29._14_2_ = auVar29._0_2_;
      auVar29._16_2_ = auVar29._0_2_;
      auVar29._18_2_ = auVar29._0_2_;
      auVar29._20_2_ = auVar29._0_2_;
      auVar29._22_2_ = auVar29._0_2_;
      auVar29._24_2_ = auVar29._0_2_;
      auVar29._26_2_ = auVar29._0_2_;
      auVar29._28_2_ = auVar29._0_2_;
      auVar29._30_2_ = auVar29._0_2_;
      uVar14 = (ulong)(uint)N;
      auVar23._8_2_ = 0x10;
      auVar23._0_8_ = 0x10001000100010;
      auVar23._10_2_ = 0x10;
      auVar23._12_2_ = 0x10;
      auVar23._14_2_ = 0x10;
      auVar23._16_2_ = 0x10;
      auVar23._18_2_ = 0x10;
      auVar23._20_2_ = 0x10;
      auVar23._22_2_ = 0x10;
      auVar23._24_2_ = 0x10;
      auVar23._26_2_ = 0x10;
      auVar23._28_2_ = 0x10;
      auVar23._30_2_ = 0x10;
      lVar19 = 0;
      auVar2 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
      uVar20 = 0;
      uVar17 = upsample_above;
      do {
        iVar18 = (int)uVar17 >> 6;
        lVar11 = lVar19;
        if (iVar18 < (int)uVar12) {
          uVar4 = (ushort)(uVar17 >> 1);
          uVar24 = uVar4 & 0x1f;
          auVar25._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar25._8_2_ = uVar24;
          auVar25._10_2_ = uVar24;
          auVar25._12_2_ = uVar24;
          auVar25._14_2_ = uVar24;
          auVar25._16_2_ = uVar24;
          auVar25._18_2_ = uVar24;
          auVar25._20_2_ = uVar24;
          auVar25._22_2_ = uVar24;
          auVar25._24_2_ = uVar24;
          auVar25._26_2_ = uVar24;
          auVar25._28_2_ = uVar24;
          auVar25._30_2_ = uVar24;
          lVar11 = (long)iVar18;
          lVar15 = 0;
          do {
            auVar27 = auVar22;
            if (lVar11 + lVar15 < (long)(ulong)uVar12) {
              auVar27 = vpsubw_avx2(*(undefined1 (*) [32])(above + lVar11 + lVar15 + 1),
                                    *(undefined1 (*) [32])(above + lVar11 + lVar15));
              auVar28 = vpmullw_avx2(auVar27,auVar25);
              auVar27 = vpsllw_avx2(*(undefined1 (*) [32])(above + lVar11 + lVar15),5);
              auVar27 = vpaddw_avx2(auVar27,auVar23);
              auVar27 = vpaddw_avx2(auVar28,auVar27);
              auVar28 = vpsrlw_avx2(auVar27,5);
              iVar3 = (int)lVar15;
              auVar32._0_2_ = (undefined2)(iVar18 + iVar3);
              auVar32._2_2_ = auVar32._0_2_;
              auVar32._4_2_ = auVar32._0_2_;
              auVar32._6_2_ = auVar32._0_2_;
              auVar32._8_2_ = auVar32._0_2_;
              auVar32._10_2_ = auVar32._0_2_;
              auVar32._12_2_ = auVar32._0_2_;
              auVar32._14_2_ = auVar32._0_2_;
              auVar32 = vpaddw_avx(auVar32,auVar2);
              auVar34 = vpslldq_avx(auVar32,2);
              auVar34 = vpblendw_avx(auVar34,ZEXT416((uint)(iVar18 + iVar3)),1);
              auVar32 = vpsrldq_avx(auVar32,0xe);
              auVar33._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar21;
              auVar33._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar32;
              auVar35._0_2_ = (undefined2)(iVar18 + 9 + iVar3);
              auVar35._2_2_ = auVar35._0_2_;
              auVar35._4_2_ = auVar35._0_2_;
              auVar35._6_2_ = auVar35._0_2_;
              auVar35._8_2_ = auVar35._0_2_;
              auVar35._10_2_ = auVar35._0_2_;
              auVar35._12_2_ = auVar35._0_2_;
              auVar35._14_2_ = auVar35._0_2_;
              auVar35._16_2_ = auVar35._0_2_;
              auVar35._18_2_ = auVar35._0_2_;
              auVar35._20_2_ = auVar35._0_2_;
              auVar35._22_2_ = auVar35._0_2_;
              auVar35._24_2_ = auVar35._0_2_;
              auVar35._26_2_ = auVar35._0_2_;
              auVar35._28_2_ = auVar35._0_2_;
              auVar35._30_2_ = auVar35._0_2_;
              auVar27 = vpblendw_avx2(auVar33,auVar35,2);
              auVar36._0_2_ = (undefined2)(iVar18 + 10 + iVar3);
              auVar36._2_2_ = auVar36._0_2_;
              auVar36._4_2_ = auVar36._0_2_;
              auVar36._6_2_ = auVar36._0_2_;
              auVar36._8_2_ = auVar36._0_2_;
              auVar36._10_2_ = auVar36._0_2_;
              auVar36._12_2_ = auVar36._0_2_;
              auVar36._14_2_ = auVar36._0_2_;
              auVar36._16_2_ = auVar36._0_2_;
              auVar36._18_2_ = auVar36._0_2_;
              auVar36._20_2_ = auVar36._0_2_;
              auVar36._22_2_ = auVar36._0_2_;
              auVar36._24_2_ = auVar36._0_2_;
              auVar36._26_2_ = auVar36._0_2_;
              auVar36._28_2_ = auVar36._0_2_;
              auVar36._30_2_ = auVar36._0_2_;
              auVar27 = vpblendw_avx2(auVar27,auVar36,4);
              auVar37._0_2_ = (undefined2)(iVar18 + 0xb + iVar3);
              auVar37._2_2_ = auVar37._0_2_;
              auVar37._4_2_ = auVar37._0_2_;
              auVar37._6_2_ = auVar37._0_2_;
              auVar37._8_2_ = auVar37._0_2_;
              auVar37._10_2_ = auVar37._0_2_;
              auVar37._12_2_ = auVar37._0_2_;
              auVar37._14_2_ = auVar37._0_2_;
              auVar37._16_2_ = auVar37._0_2_;
              auVar37._18_2_ = auVar37._0_2_;
              auVar37._20_2_ = auVar37._0_2_;
              auVar37._22_2_ = auVar37._0_2_;
              auVar37._24_2_ = auVar37._0_2_;
              auVar37._26_2_ = auVar37._0_2_;
              auVar37._28_2_ = auVar37._0_2_;
              auVar37._30_2_ = auVar37._0_2_;
              auVar27 = vpblendw_avx2(auVar27,auVar37,8);
              auVar38._0_2_ = (undefined2)(iVar18 + 0xc + iVar3);
              auVar38._2_2_ = auVar38._0_2_;
              auVar38._4_2_ = auVar38._0_2_;
              auVar38._6_2_ = auVar38._0_2_;
              auVar38._8_2_ = auVar38._0_2_;
              auVar38._10_2_ = auVar38._0_2_;
              auVar38._12_2_ = auVar38._0_2_;
              auVar38._14_2_ = auVar38._0_2_;
              auVar38._16_2_ = auVar38._0_2_;
              auVar38._18_2_ = auVar38._0_2_;
              auVar38._20_2_ = auVar38._0_2_;
              auVar38._22_2_ = auVar38._0_2_;
              auVar38._24_2_ = auVar38._0_2_;
              auVar38._26_2_ = auVar38._0_2_;
              auVar38._28_2_ = auVar38._0_2_;
              auVar38._30_2_ = auVar38._0_2_;
              auVar27 = vpblendw_avx2(auVar27,auVar38,0x10);
              auVar39._0_2_ = (undefined2)(iVar18 + 0xd + iVar3);
              auVar39._2_2_ = auVar39._0_2_;
              auVar39._4_2_ = auVar39._0_2_;
              auVar39._6_2_ = auVar39._0_2_;
              auVar39._8_2_ = auVar39._0_2_;
              auVar39._10_2_ = auVar39._0_2_;
              auVar39._12_2_ = auVar39._0_2_;
              auVar39._14_2_ = auVar39._0_2_;
              auVar39._16_2_ = auVar39._0_2_;
              auVar39._18_2_ = auVar39._0_2_;
              auVar39._20_2_ = auVar39._0_2_;
              auVar39._22_2_ = auVar39._0_2_;
              auVar39._24_2_ = auVar39._0_2_;
              auVar39._26_2_ = auVar39._0_2_;
              auVar39._28_2_ = auVar39._0_2_;
              auVar39._30_2_ = auVar39._0_2_;
              auVar27 = vpblendw_avx2(auVar27,auVar39,0x20);
              auVar40._0_2_ = (undefined2)(iVar18 + 0xe + iVar3);
              auVar40._2_2_ = auVar40._0_2_;
              auVar40._4_2_ = auVar40._0_2_;
              auVar40._6_2_ = auVar40._0_2_;
              auVar40._8_2_ = auVar40._0_2_;
              auVar40._10_2_ = auVar40._0_2_;
              auVar40._12_2_ = auVar40._0_2_;
              auVar40._14_2_ = auVar40._0_2_;
              auVar40._16_2_ = auVar40._0_2_;
              auVar40._18_2_ = auVar40._0_2_;
              auVar40._20_2_ = auVar40._0_2_;
              auVar40._22_2_ = auVar40._0_2_;
              auVar40._24_2_ = auVar40._0_2_;
              auVar40._26_2_ = auVar40._0_2_;
              auVar40._28_2_ = auVar40._0_2_;
              auVar40._30_2_ = auVar40._0_2_;
              auVar27 = vpblendw_avx2(auVar27,auVar40,0x40);
              auVar41._0_2_ = (undefined2)(iVar18 + 0xf + iVar3);
              auVar41._2_2_ = auVar41._0_2_;
              auVar41._4_2_ = auVar41._0_2_;
              auVar41._6_2_ = auVar41._0_2_;
              auVar41._8_2_ = auVar41._0_2_;
              auVar41._10_2_ = auVar41._0_2_;
              auVar41._12_2_ = auVar41._0_2_;
              auVar41._14_2_ = auVar41._0_2_;
              auVar41._16_2_ = auVar41._0_2_;
              auVar41._18_2_ = auVar41._0_2_;
              auVar41._20_2_ = auVar41._0_2_;
              auVar41._22_2_ = auVar41._0_2_;
              auVar41._24_2_ = auVar41._0_2_;
              auVar41._26_2_ = auVar41._0_2_;
              auVar41._28_2_ = auVar41._0_2_;
              auVar41._30_2_ = auVar41._0_2_;
              auVar27 = vpblendw_avx2(auVar27,auVar41,0x80);
              auVar27 = vpblendd_avx2(ZEXT1632(auVar34),auVar27,0xf0);
              auVar27 = vpcmpgtw_avx2(auVar29,auVar27);
              auVar27 = vpblendvb_avx2(auVar22,auVar28,auVar27);
            }
            puVar5 = auStack_1060 + uVar14 * 4;
            if (lVar15 == 0) {
              puVar5 = auStack_1060;
            }
            *(undefined1 (*) [32])(puVar5 + uVar20 * 4) = auVar27;
            lVar15 = lVar15 + 0x10;
          } while (lVar15 == 0x10);
          uVar17 = uVar17 + upsample_above;
        }
        else {
          do {
            *(undefined1 (*) [32])((long)auStack_1060 + lVar11) = auVar22;
            *(undefined1 (*) [32])((long)(auStack_1060 + uVar14 * 4) + lVar11) = auVar22;
            lVar11 = lVar11 + 0x20;
          } while (uVar14 * 0x20 != lVar11);
        }
        if ((int)uVar12 <= iVar18) break;
        uVar20 = uVar20 + 1;
        lVar19 = lVar19 + 0x20;
      } while (uVar20 != uVar14);
    }
  }
  else if (0 < N) {
    auVar27._2_2_ = auVar29._0_2_;
    auVar27._0_2_ = auVar29._0_2_;
    auVar27._4_2_ = auVar29._0_2_;
    auVar27._6_2_ = auVar29._0_2_;
    auVar27._8_2_ = auVar29._0_2_;
    auVar27._10_2_ = auVar29._0_2_;
    auVar27._12_2_ = auVar29._0_2_;
    auVar27._14_2_ = auVar29._0_2_;
    auVar27._16_2_ = auVar29._0_2_;
    auVar27._18_2_ = auVar29._0_2_;
    auVar27._20_2_ = auVar29._0_2_;
    auVar27._22_2_ = auVar29._0_2_;
    auVar27._24_2_ = auVar29._0_2_;
    auVar27._26_2_ = auVar29._0_2_;
    auVar27._28_2_ = auVar29._0_2_;
    auVar27._30_2_ = auVar29._0_2_;
    uVar14 = (ulong)(uint)N;
    auVar28._8_4_ = 0x10;
    auVar28._0_8_ = 0x1000000010;
    auVar28._12_4_ = 0x10;
    auVar28._16_4_ = 0x10;
    auVar28._20_4_ = 0x10;
    auVar28._24_4_ = 0x10;
    auVar28._28_4_ = 0x10;
    lVar19 = 0;
    auVar2 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
    uVar20 = 0;
    uVar17 = upsample_above;
    do {
      iVar18 = (int)uVar17 >> 6;
      lVar11 = lVar19;
      if (iVar18 < (int)uVar12) {
        uVar9 = uVar17 >> 1;
        uVar10 = uVar9 & 0x1f801f;
        auVar26._0_8_ = CONCAT44(uVar9,uVar9) & 0x1f801f001f801f;
        auVar26._8_4_ = uVar10;
        auVar26._12_4_ = uVar10;
        auVar26._16_4_ = uVar10;
        auVar26._20_4_ = uVar10;
        auVar26._24_4_ = uVar10;
        auVar26._28_4_ = uVar10;
        lVar11 = (long)iVar18;
        lVar13 = (ulong)uVar12 - lVar11;
        lVar15 = -0x10;
        do {
          auVar29 = auVar22;
          if (0 < lVar13) {
            auVar32 = auVar21;
            if (8 < lVar13) {
              auVar29 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar11 + lVar15 + 0x18));
              auVar31 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar11 + lVar15 + 0x19));
              auVar31 = vpsubd_avx2(auVar31,auVar29);
              auVar29 = vpslld_avx2(auVar29,5);
              auVar31 = vpmulld_avx2(auVar31,auVar26);
              auVar29 = vpaddd_avx2(auVar29,auVar28);
              auVar29 = vpaddd_avx2(auVar31,auVar29);
              auVar29 = vpsrld_avx2(auVar29,5);
              auVar31._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar29._16_16_;
              auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21
              ;
              auVar29 = vpackusdw_avx2(auVar29,auVar31);
              auVar32 = auVar29._0_16_;
            }
            auVar29 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar11 + lVar15 + 0x10));
            auVar31 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar11 + lVar15 + 0x11));
            auVar31 = vpsubd_avx2(auVar31,auVar29);
            auVar29 = vpslld_avx2(auVar29,5);
            auVar31 = vpmulld_avx2(auVar31,auVar26);
            auVar29 = vpaddd_avx2(auVar29,auVar28);
            auVar29 = vpaddd_avx2(auVar31,auVar29);
            auVar29 = vpsrld_avx2(auVar29,5);
            auVar29 = vpackusdw_avx2(auVar29,ZEXT1632(auVar29._16_16_));
            iVar3 = (int)lVar15;
            uVar9 = iVar18 + 0x10 + iVar3;
            auVar34._0_2_ = (undefined2)uVar9;
            auVar34._2_2_ = auVar34._0_2_;
            auVar34._4_2_ = auVar34._0_2_;
            auVar34._6_2_ = auVar34._0_2_;
            auVar34._8_2_ = auVar34._0_2_;
            auVar34._10_2_ = auVar34._0_2_;
            auVar34._12_2_ = auVar34._0_2_;
            auVar34._14_2_ = auVar34._0_2_;
            auVar34 = vpaddw_avx(auVar34,auVar2);
            auVar43 = vpslldq_avx(auVar34,2);
            auVar43 = vpblendw_avx(auVar43,ZEXT416(uVar9),1);
            auVar34 = vpsrldq_avx(auVar34,0xe);
            auVar42._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar21;
            auVar42._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar34;
            auVar44._0_2_ = (undefined2)(iVar18 + 0x19 + iVar3);
            auVar44._2_2_ = auVar44._0_2_;
            auVar44._4_2_ = auVar44._0_2_;
            auVar44._6_2_ = auVar44._0_2_;
            auVar44._8_2_ = auVar44._0_2_;
            auVar44._10_2_ = auVar44._0_2_;
            auVar44._12_2_ = auVar44._0_2_;
            auVar44._14_2_ = auVar44._0_2_;
            auVar44._16_2_ = auVar44._0_2_;
            auVar44._18_2_ = auVar44._0_2_;
            auVar44._20_2_ = auVar44._0_2_;
            auVar44._22_2_ = auVar44._0_2_;
            auVar44._24_2_ = auVar44._0_2_;
            auVar44._26_2_ = auVar44._0_2_;
            auVar44._28_2_ = auVar44._0_2_;
            auVar44._30_2_ = auVar44._0_2_;
            auVar31 = vpblendw_avx2(auVar42,auVar44,2);
            auVar45._0_2_ = (undefined2)(iVar18 + 0x1a + iVar3);
            auVar45._2_2_ = auVar45._0_2_;
            auVar45._4_2_ = auVar45._0_2_;
            auVar45._6_2_ = auVar45._0_2_;
            auVar45._8_2_ = auVar45._0_2_;
            auVar45._10_2_ = auVar45._0_2_;
            auVar45._12_2_ = auVar45._0_2_;
            auVar45._14_2_ = auVar45._0_2_;
            auVar45._16_2_ = auVar45._0_2_;
            auVar45._18_2_ = auVar45._0_2_;
            auVar45._20_2_ = auVar45._0_2_;
            auVar45._22_2_ = auVar45._0_2_;
            auVar45._24_2_ = auVar45._0_2_;
            auVar45._26_2_ = auVar45._0_2_;
            auVar45._28_2_ = auVar45._0_2_;
            auVar45._30_2_ = auVar45._0_2_;
            auVar31 = vpblendw_avx2(auVar31,auVar45,4);
            auVar46._0_2_ = (undefined2)(iVar18 + 0x1b + iVar3);
            auVar46._2_2_ = auVar46._0_2_;
            auVar46._4_2_ = auVar46._0_2_;
            auVar46._6_2_ = auVar46._0_2_;
            auVar46._8_2_ = auVar46._0_2_;
            auVar46._10_2_ = auVar46._0_2_;
            auVar46._12_2_ = auVar46._0_2_;
            auVar46._14_2_ = auVar46._0_2_;
            auVar46._16_2_ = auVar46._0_2_;
            auVar46._18_2_ = auVar46._0_2_;
            auVar46._20_2_ = auVar46._0_2_;
            auVar46._22_2_ = auVar46._0_2_;
            auVar46._24_2_ = auVar46._0_2_;
            auVar46._26_2_ = auVar46._0_2_;
            auVar46._28_2_ = auVar46._0_2_;
            auVar46._30_2_ = auVar46._0_2_;
            auVar31 = vpblendw_avx2(auVar31,auVar46,8);
            auVar47._0_2_ = (undefined2)(iVar18 + 0x1c + iVar3);
            auVar47._2_2_ = auVar47._0_2_;
            auVar47._4_2_ = auVar47._0_2_;
            auVar47._6_2_ = auVar47._0_2_;
            auVar47._8_2_ = auVar47._0_2_;
            auVar47._10_2_ = auVar47._0_2_;
            auVar47._12_2_ = auVar47._0_2_;
            auVar47._14_2_ = auVar47._0_2_;
            auVar47._16_2_ = auVar47._0_2_;
            auVar47._18_2_ = auVar47._0_2_;
            auVar47._20_2_ = auVar47._0_2_;
            auVar47._22_2_ = auVar47._0_2_;
            auVar47._24_2_ = auVar47._0_2_;
            auVar47._26_2_ = auVar47._0_2_;
            auVar47._28_2_ = auVar47._0_2_;
            auVar47._30_2_ = auVar47._0_2_;
            auVar31 = vpblendw_avx2(auVar31,auVar47,0x10);
            auVar48._0_2_ = (undefined2)(iVar18 + 0x1d + iVar3);
            auVar48._2_2_ = auVar48._0_2_;
            auVar48._4_2_ = auVar48._0_2_;
            auVar48._6_2_ = auVar48._0_2_;
            auVar48._8_2_ = auVar48._0_2_;
            auVar48._10_2_ = auVar48._0_2_;
            auVar48._12_2_ = auVar48._0_2_;
            auVar48._14_2_ = auVar48._0_2_;
            auVar48._16_2_ = auVar48._0_2_;
            auVar48._18_2_ = auVar48._0_2_;
            auVar48._20_2_ = auVar48._0_2_;
            auVar48._22_2_ = auVar48._0_2_;
            auVar48._24_2_ = auVar48._0_2_;
            auVar48._26_2_ = auVar48._0_2_;
            auVar48._28_2_ = auVar48._0_2_;
            auVar48._30_2_ = auVar48._0_2_;
            auVar31 = vpblendw_avx2(auVar31,auVar48,0x20);
            auVar49._0_2_ = (undefined2)(iVar18 + 0x1e + iVar3);
            auVar49._2_2_ = auVar49._0_2_;
            auVar49._4_2_ = auVar49._0_2_;
            auVar49._6_2_ = auVar49._0_2_;
            auVar49._8_2_ = auVar49._0_2_;
            auVar49._10_2_ = auVar49._0_2_;
            auVar49._12_2_ = auVar49._0_2_;
            auVar49._14_2_ = auVar49._0_2_;
            auVar49._16_2_ = auVar49._0_2_;
            auVar49._18_2_ = auVar49._0_2_;
            auVar49._20_2_ = auVar49._0_2_;
            auVar49._22_2_ = auVar49._0_2_;
            auVar49._24_2_ = auVar49._0_2_;
            auVar49._26_2_ = auVar49._0_2_;
            auVar49._28_2_ = auVar49._0_2_;
            auVar49._30_2_ = auVar49._0_2_;
            auVar31 = vpblendw_avx2(auVar31,auVar49,0x40);
            auVar50._0_2_ = (undefined2)(iVar18 + 0x1f + iVar3);
            auVar50._2_2_ = auVar50._0_2_;
            auVar50._4_2_ = auVar50._0_2_;
            auVar50._6_2_ = auVar50._0_2_;
            auVar50._8_2_ = auVar50._0_2_;
            auVar50._10_2_ = auVar50._0_2_;
            auVar50._12_2_ = auVar50._0_2_;
            auVar50._14_2_ = auVar50._0_2_;
            auVar50._16_2_ = auVar50._0_2_;
            auVar50._18_2_ = auVar50._0_2_;
            auVar50._20_2_ = auVar50._0_2_;
            auVar50._22_2_ = auVar50._0_2_;
            auVar50._24_2_ = auVar50._0_2_;
            auVar50._26_2_ = auVar50._0_2_;
            auVar50._28_2_ = auVar50._0_2_;
            auVar50._30_2_ = auVar50._0_2_;
            auVar31 = vpblendw_avx2(auVar31,auVar50,0x80);
            auVar31 = vpblendd_avx2(ZEXT1632(auVar43),auVar31,0xf0);
            auVar31 = vpcmpgtw_avx2(auVar27,auVar31);
            auVar30._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar29._0_16_;
            auVar30._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar32;
            auVar29 = vpblendvb_avx2(auVar22,auVar30,auVar31);
          }
          puVar5 = auStack_1060 + uVar14 * 4;
          if (lVar15 == -0x10) {
            puVar5 = auStack_1060;
          }
          *(undefined1 (*) [32])(puVar5 + uVar20 * 4) = auVar29;
          lVar13 = lVar13 + -0x10;
          lVar15 = lVar15 + 0x10;
        } while (lVar15 == 0);
        uVar17 = uVar17 + upsample_above;
      }
      else {
        do {
          *(undefined1 (*) [32])((long)auStack_1060 + lVar11) = auVar22;
          *(undefined1 (*) [32])((long)(auStack_1060 + uVar14 * 4) + lVar11) = auVar22;
          lVar11 = lVar11 + 0x20;
        } while (uVar14 * 0x20 != lVar11);
      }
      if ((int)uVar12 <= iVar18) break;
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x20;
    } while (uVar20 != uVar14);
  }
  if (0 < N) {
    puVar16 = dst + 0x10;
    lVar19 = 0;
    do {
      uVar6 = *(undefined8 *)((long)auStack_1060 + lVar19 + 8);
      uVar7 = *(undefined8 *)((long)auStack_1060 + lVar19 + 0x10);
      uVar8 = *(undefined8 *)((long)auStack_1060 + lVar19 + 0x18);
      *(undefined8 *)(puVar16 + -0x10) = *(undefined8 *)((long)auStack_1060 + lVar19);
      *(undefined8 *)(puVar16 + -0xc) = uVar6;
      *(undefined8 *)(puVar16 + -8) = uVar7;
      *(undefined8 *)(puVar16 + -4) = uVar8;
      puVar5 = (undefined8 *)((long)auStack_1060 + lVar19 + (ulong)(uint)N * 0x20);
      uVar6 = puVar5[1];
      uVar7 = puVar5[2];
      uVar8 = puVar5[3];
      *(undefined8 *)puVar16 = *puVar5;
      *(undefined8 *)(puVar16 + 4) = uVar6;
      *(undefined8 *)(puVar16 + 8) = uVar7;
      *(undefined8 *)(puVar16 + 0xc) = uVar8;
      lVar19 = lVar19 + 0x20;
      puVar16 = puVar16 + stride;
    } while ((ulong)(uint)N * 0x20 != lVar19);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_32xN_avx2(int N, uint16_t *dst,
                                              ptrdiff_t stride,
                                              const uint16_t *above,
                                              int upsample_above, int dx,
                                              int bd) {
  __m256i dstvec[128];
  if (bd < 12) {
    highbd_dr_prediction_z1_32xN_internal_avx2(N, dstvec, above, upsample_above,
                                               dx);
  } else {
    highbd_dr_prediction_32bit_z1_32xN_internal_avx2(N, dstvec, above,
                                                     upsample_above, dx);
  }
  for (int i = 0; i < N; i++) {
    _mm256_storeu_si256((__m256i *)(dst + stride * i), dstvec[i]);
    _mm256_storeu_si256((__m256i *)(dst + stride * i + 16), dstvec[i + N]);
  }
}